

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextedit.cpp
# Opt level: O2

int __thiscall QTextEdit::fontWeight(QTextEdit *this)

{
  int iVar1;
  long in_FS_OFFSET;
  QWidgetTextControl aQStack_38 [8];
  QTextFormat local_30 [16];
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  QWidgetTextControl::textCursor(aQStack_38);
  QTextCursor::charFormat();
  iVar1 = QTextCharFormat::fontWeight((QTextCharFormat *)local_30);
  QTextFormat::~QTextFormat(local_30);
  QTextCursor::~QTextCursor((QTextCursor *)aQStack_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return iVar1;
  }
  __stack_chk_fail();
}

Assistant:

int QTextEdit::fontWeight() const
{
    Q_D(const QTextEdit);
    return d->control->textCursor().charFormat().fontWeight();
}